

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::Resign(CommissionerSafe *this,ErrorHandler *aHandler)

{
  anon_class_40_2_1bbb15e4 local_60;
  AsyncRequest local_38;
  ErrorHandler *local_18;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_60.this = this;
  local_18 = aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_60.aHandler,aHandler);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::Resign(std::function<void(ot::commissioner::Error)>)::__0,void>
            ((function<void()> *)&local_38,&local_60);
  PushAsyncRequest(this,&local_38);
  std::function<void_()>::~function(&local_38);
  Resign(std::function<void(ot::commissioner::Error)>)::$_0::~__0((__0 *)&local_60);
  return;
}

Assistant:

void CommissionerSafe::Resign(ErrorHandler aHandler)
{
    PushAsyncRequest([=]() { mImpl->Resign(aHandler); });
}